

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InferenceStore.cpp
# Opt level: O0

void __thiscall
Kernel::InferenceStore::outputUnsatCore(InferenceStore *this,ostream *out,Unit *refutation)

{
  bool bVar1;
  InferenceRule IVar2;
  undefined1 uVar3;
  ostream *poVar4;
  Inference *this_00;
  Set<Kernel::Unit_*,_Lib::DefaultHash> *this_01;
  ostream *in_RSI;
  Unit *parent;
  UnitIterator parents;
  string label;
  Unit *u;
  Set<Kernel::Unit_*,_Lib::DefaultHash> visited;
  Stack<Kernel::Unit_*> todo;
  Unit *in_stack_fffffffffffffe88;
  Stack<Kernel::Unit_*> *in_stack_fffffffffffffe90;
  undefined7 in_stack_fffffffffffffe98;
  undefined1 in_stack_fffffffffffffe9f;
  Unit *in_stack_fffffffffffffea0;
  undefined7 in_stack_fffffffffffffea8;
  Unit *in_stack_fffffffffffffeb8;
  string local_b8 [32];
  string local_98 [32];
  Unit *local_78;
  Stack<Kernel::Unit_*> local_38;
  ostream *local_10;
  
  local_10 = in_RSI;
  poVar4 = std::operator<<(in_RSI,"(");
  std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
  Lib::Stack<Kernel::Unit_*>::Stack
            ((Stack<Kernel::Unit_*> *)in_stack_fffffffffffffea0,
             CONCAT17(in_stack_fffffffffffffe9f,in_stack_fffffffffffffe98));
  Lib::Stack<Kernel::Unit_*>::push(in_stack_fffffffffffffe90,in_stack_fffffffffffffe88);
  Lib::Set<Kernel::Unit_*,_Lib::DefaultHash>::Set((Set<Kernel::Unit_*,_Lib::DefaultHash> *)0x8659df)
  ;
  while (bVar1 = Lib::Stack<Kernel::Unit_*>::isEmpty(&local_38), ((bVar1 ^ 0xffU) & 1) != 0) {
    local_78 = Lib::Stack<Kernel::Unit_*>::pop(&local_38);
    Lib::Set<Kernel::Unit_*,_Lib::DefaultHash>::insert
              ((Set<Kernel::Unit_*,_Lib::DefaultHash> *)in_stack_fffffffffffffea0,
               (Unit *)CONCAT17(in_stack_fffffffffffffe9f,in_stack_fffffffffffffe98));
    this_00 = Unit::inference(local_78);
    IVar2 = Inference::rule(this_00);
    if (IVar2 == INPUT) {
      bVar1 = Unit::isClause(local_78);
      if (!bVar1) {
        Unit::getFormula(in_stack_fffffffffffffe88);
        bVar1 = Formula::hasLabel((Formula *)0x865ad0);
        if (bVar1) {
          Unit::getFormula(in_stack_fffffffffffffe88);
          Formula::getLabel_abi_cxx11_((Formula *)in_stack_fffffffffffffe88);
          poVar4 = std::operator<<(local_10,local_98);
          std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
          std::__cxx11::string::~string(local_98);
        }
        else {
          bVar1 = Shell::Options::ignoreMissingInputsInUnsatCore(Lib::env);
          if (!bVar1) {
            Unit::getFormula(in_stack_fffffffffffffe88);
            bVar1 = Formula::hasLabel((Formula *)0x865be5);
            if (!bVar1) {
              poVar4 = std::operator<<((ostream *)&std::cout,
                                       "ERROR: There is a problem with the unsat core. There is an input formula in the proof"
                                      );
              std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
              poVar4 = std::operator<<((ostream *)&std::cout,
                                       "that does not have a label. We expect all  input formulas to have labels as this  is what"
                                      );
              std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
              poVar4 = std::operator<<((ostream *)&std::cout,
                                       "smtcomp does. If you don\'t want this then use the ignore_missing_inputs_in_unsat_core option"
                                      );
              std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
              in_stack_fffffffffffffeb8 =
                   (Unit *)std::operator<<((ostream *)&std::cout,"The unlabelled  input formula is "
                                          );
              std::ostream::operator<<
                        (in_stack_fffffffffffffeb8,std::endl<char,std::char_traits<char>>);
              Unit::toString_abi_cxx11_
                        ((Unit *)CONCAT17(in_stack_fffffffffffffe9f,in_stack_fffffffffffffe98));
              poVar4 = std::operator<<((ostream *)&std::cout,local_b8);
              std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
              std::__cxx11::string::~string(local_b8);
            }
          }
        }
      }
    }
    else {
      Unit::getParents(in_stack_fffffffffffffeb8);
      while (uVar3 = Lib::VirtualIterator<Kernel::Unit_*>::hasNext
                               ((VirtualIterator<Kernel::Unit_*> *)0x865d58), (bool)uVar3) {
        in_stack_fffffffffffffea0 =
             Lib::VirtualIterator<Kernel::Unit_*>::next((VirtualIterator<Kernel::Unit_*> *)0x865d78)
        ;
        in_stack_fffffffffffffe9f =
             Lib::Set<Kernel::Unit_*,_Lib::DefaultHash>::contains
                       ((Set<Kernel::Unit_*,_Lib::DefaultHash> *)
                        CONCAT17(uVar3,in_stack_fffffffffffffea8),in_stack_fffffffffffffea0);
        if (!(bool)in_stack_fffffffffffffe9f) {
          Lib::Stack<Kernel::Unit_*>::push(in_stack_fffffffffffffe90,in_stack_fffffffffffffe88);
        }
      }
      Lib::VirtualIterator<Kernel::Unit_*>::~VirtualIterator
                ((VirtualIterator<Kernel::Unit_*> *)in_stack_fffffffffffffe90);
    }
  }
  this_01 = (Set<Kernel::Unit_*,_Lib::DefaultHash> *)std::operator<<(local_10,")");
  std::ostream::operator<<(this_01,std::endl<char,std::char_traits<char>>);
  Lib::Set<Kernel::Unit_*,_Lib::DefaultHash>::~Set(this_01);
  Lib::Stack<Kernel::Unit_*>::~Stack((Stack<Kernel::Unit_*> *)this_01);
  return;
}

Assistant:

void InferenceStore::outputUnsatCore(std::ostream& out, Unit* refutation)
{
  out << "(" << endl;

  Stack<Unit*> todo;
  todo.push(refutation);
  Set<Unit*> visited;
  while(!todo.isEmpty()){

    Unit* u = todo.pop();
    visited.insert(u);

    if(u->inference().rule() ==  InferenceRule::INPUT){
      if(!u->isClause()){
        if(u->getFormula()->hasLabel()){
          std::string label =  u->getFormula()->getLabel();
          out << label << endl;
        }
        else{
          ASS(env.options->ignoreMissingInputsInUnsatCore() || u->getFormula()->hasLabel());
          if(!(env.options->ignoreMissingInputsInUnsatCore() || u->getFormula()->hasLabel())){
            cout << "ERROR: There is a problem with the unsat core. There is an input formula in the proof" <<  endl;
            cout << "that does not have a label. We expect all  input formulas to have labels as this  is what" << endl;
            cout << "smtcomp does. If you don't want this then use the ignore_missing_inputs_in_unsat_core option" << endl;
            cout << "The unlabelled  input formula is " << endl;
            cout << u->toString() << endl;
          }
        }
      }
      else{
        //Currently ignore clauses as they cannot come from SMT-LIB as input formulas
      }
    }
    else{
      UnitIterator parents = u->getParents();
      while(parents.hasNext()){
        Unit* parent = parents.next();
        if(!visited.contains(parent)){
          todo.push(parent);
        }
      }
    }
  }

  out << ")" << endl;
}